

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O1

Span * __thiscall tcmalloc::PageHeap::AllocLarge(PageHeap *this,Length n)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  Span *pSVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  Span *pSVar7;
  _Base_ptr p_Var8;
  long lVar9;
  Span *span;
  
  p_Var1 = &(this->large_normal_)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &(this->large_returned_)._M_t._M_impl.super__Rb_tree_header;
  while( true ) {
    p_Var3 = (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0;
        p_Var3 = *(_Base_ptr *)((long)&((_Rb_tree_node_base *)&p_Var3->_M_color)->_M_color + lVar9))
    {
      lVar9 = 0x10;
      p_Var8 = p_Var3;
      if ((p_Var3[1]._M_parent <= n) &&
         ((p_Var3[1]._M_parent < n || (**(long **)(p_Var3 + 1) == 0)))) {
        lVar9 = 0x18;
        p_Var8 = p_Var5;
      }
      p_Var5 = p_Var8;
    }
    if ((_Rb_tree_header *)p_Var5 == p_Var1) {
      pSVar7 = (Span *)0x0;
    }
    else {
      pSVar7 = *(Span **)(p_Var5 + 1);
    }
    p_Var3 = (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var2->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0;
        p_Var3 = *(_Base_ptr *)((long)&((_Rb_tree_node_base *)&p_Var3->_M_color)->_M_color + lVar9))
    {
      lVar9 = 0x10;
      p_Var8 = p_Var3;
      if ((p_Var3[1]._M_parent <= n) &&
         ((p_Var3[1]._M_parent < n || (**(long **)(p_Var3 + 1) == 0)))) {
        lVar9 = 0x18;
        p_Var8 = p_Var5;
      }
      p_Var5 = p_Var8;
    }
    span = pSVar7;
    if (((((_Rb_tree_header *)p_Var5 != p_Var2) &&
         (pSVar4 = *(Span **)(p_Var5 + 1), span = pSVar4, pSVar7 != (Span *)0x0)) &&
        (pSVar7->length <= pSVar4->length)) &&
       ((span = pSVar7, pSVar4->length == pSVar7->length &&
        (span = pSVar4, pSVar7->start <= pSVar4->start)))) {
      span = pSVar7;
    }
    if (span == pSVar7) break;
    if ((FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
         FLAGS_tcmalloc_heap_limit_mb == 0) ||
       (((TCMalloc_SystemTaken >> 0xd) + n) - ((this->stats_).unmapped_bytes >> 0xd) <=
        (ulong)(FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
                FLAGS_tcmalloc_heap_limit_mb << 7))) goto LAB_0011c7e0;
    bVar6 = EnsureLimit(this,n,true);
    if (!bVar6) {
      return (Span *)0x0;
    }
  }
  if (span == (Span *)0x0) {
    return (Span *)0x0;
  }
LAB_0011c7e0:
  Carve(this,span,n);
  return span;
}

Assistant:

Span* PageHeap::AllocLarge(Length n) {
  ASSERT(lock_.IsHeld());
  Span *best = nullptr;
  Span *best_normal = nullptr;

  // Create a Span to use as an upper bound.
  Span bound;
  bound.start = 0;
  bound.length = n;

  // First search the NORMAL spans..
  SpanSetIter place = large_normal_.upper_bound(SpanPtrWithLength(&bound));
  if (place != large_normal_.end()) {
    best = place->span;
    best_normal = best;
    ASSERT(best->location == Span::ON_NORMAL_FREELIST);
  }

  // Try to find better fit from RETURNED spans.
  place = large_returned_.upper_bound(SpanPtrWithLength(&bound));
  if (place != large_returned_.end()) {
    Span *c = place->span;
    ASSERT(c->location == Span::ON_RETURNED_FREELIST);
    if (best_normal == nullptr
        || c->length < best->length
        || (c->length == best->length && c->start < best->start))
      best = place->span;
  }

  if (best == best_normal) {
    return best == nullptr ? nullptr : Carve(best, n);
  }

  // best comes from RETURNED set.

  if (EnsureLimit(n, false)) {
    return Carve(best, n);
  }

  if (EnsureLimit(n, true)) {
    // best could have been destroyed by coalescing.
    // best_normal is not a best-fit, and it could be destroyed as well.
    // We retry, the limit is already ensured:
    return AllocLarge(n);
  }

  // If best_normal existed, EnsureLimit would succeeded:
  ASSERT(best_normal == nullptr);
  // We are not allowed to take best from returned list.
  return nullptr;
}